

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverse.cpp
# Opt level: O3

string_t __thiscall
duckdb::ReverseOperator::Operation<duckdb::string_t,duckdb::string_t>
          (ReverseOperator *this,string_t input,Vector *result)

{
  Vector *pVVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  char cVar5;
  char *s;
  Vector *pVVar6;
  Vector *vector;
  undefined1 *puVar7;
  GraphemeIterator GVar8;
  GraphemeCluster GVar9;
  string_t sVar10;
  string_t target;
  GraphemeClusterIterator __end1;
  GraphemeClusterIterator __begin1;
  undefined1 local_90 [16];
  undefined8 local_80;
  char *local_78;
  GraphemeClusterIterator local_70;
  GraphemeClusterIterator local_50;
  
  local_78 = input.value._0_8_;
  s = local_78;
  if ((uint)this < 0xd) {
    s = (char *)((long)&local_80 + 4);
  }
  vector = (Vector *)((ulong)this & 0xffffffff);
  local_80 = this;
  local_90 = (undefined1  [16])
             StringVector::EmptyString(input.value._8_8_,vector,(idx_t)input.value._8_8_);
  puVar7 = local_90._8_8_;
  if (local_90._0_4_ < 0xd) {
    puVar7 = local_90 + 4;
  }
  if ((uint)this != 0) {
    cVar5 = *s;
    if (-1 < cVar5) {
      pcVar3 = puVar7 + (long)&vector->vector_type;
      pVVar1 = (Vector *)&DAT_00000001;
      do {
        pVVar6 = pVVar1;
        pcVar3 = pcVar3 + -1;
        *pcVar3 = cVar5;
        if (vector == pVVar6) break;
        cVar5 = s[(long)pVVar6];
        pVVar1 = (Vector *)&pVVar6->field_0x1;
      } while (-1 < cVar5);
      if (vector <= pVVar6) goto LAB_01c48a65;
    }
    GVar8 = Utf8Proc::GraphemeClusters(s,(size_t)vector);
    GraphemeIterator::GraphemeClusterIterator::GraphemeClusterIterator(&local_50,GVar8.s,GVar8.len);
    GraphemeIterator::GraphemeClusterIterator::GraphemeClusterIterator(&local_70,(char *)0x0,0);
    bVar2 = GraphemeIterator::GraphemeClusterIterator::operator!=(&local_50,&local_70);
    if (bVar2) {
      do {
        GVar9 = GraphemeIterator::GraphemeClusterIterator::operator*(&local_50);
        switchD_012b9b0d::default
                  (puVar7 + (long)vector + -GVar9.end,s + GVar9.start,GVar9.end - GVar9.start);
        GraphemeIterator::GraphemeClusterIterator::operator++(&local_50);
        bVar2 = GraphemeIterator::GraphemeClusterIterator::operator!=(&local_50,&local_70);
      } while (bVar2);
    }
  }
LAB_01c48a65:
  uVar4 = (ulong)(uint)local_90._0_4_;
  if (uVar4 < 0xd) {
    switchD_012e3010::default(local_90 + 4 + uVar4,0,0xc - uVar4);
  }
  else {
    local_90._4_4_ = *(undefined4 *)local_90._8_8_;
  }
  sVar10.value.pointer.ptr = (char *)local_90._8_8_;
  sVar10.value._0_8_ = local_90._0_8_;
  return (string_t)sVar10.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_data = input.GetData();
		auto input_length = input.GetSize();

		auto target = StringVector::EmptyString(result, input_length);
		auto target_data = target.GetDataWriteable();
		if (!StrReverseASCII(input_data, input_length, target_data)) {
			StrReverseUnicode(input_data, input_length, target_data);
		}
		target.Finalize();
		return target;
	}